

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_flush(lua_State *L)

{
  lua_State *in_RDI;
  int traceno;
  int in_stack_00000040;
  int in_stack_00000044;
  lua_State *in_stack_00000048;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((in_RDI->base < in_RDI->top) && ((in_RDI->base->field_2).it < 0xffff0000)) {
    lj_lib_checkint((lua_State *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    (int)((ulong)in_RDI >> 0x20));
    luaJIT_setmode(in_stack_00000048,in_stack_00000044,in_stack_00000040);
    iVar1 = 0;
  }
  else {
    iVar1 = setjitmode(in_RDI,in_stack_ffffffffffffffec);
  }
  return iVar1;
}

Assistant:

LJLIB_CF(jit_flush)
{
#if LJ_HASJIT
  if (L->base < L->top && tvisnumber(L->base)) {
    int traceno = lj_lib_checkint(L, 1);
    luaJIT_setmode(L, traceno, LUAJIT_MODE_FLUSH|LUAJIT_MODE_TRACE);
    return 0;
  }
#endif
  return setjitmode(L, LUAJIT_MODE_FLUSH);
}